

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_partitioned.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  double dVar12;
  SUNContext ctx;
  UserData user_data;
  SUNStepper steppers [2];
  sunrealtype tret;
  void *arkode_mem;
  void *nonlinear_mem;
  void *linear_mem;
  undefined8 local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined8 local_68;
  undefined8 local_60;
  long local_58;
  long local_50;
  double local_48;
  long local_40;
  long local_38;
  
  if (argc < 2) {
    pcVar10 = "splitting";
  }
  else {
    pcVar10 = argv[1];
  }
  iVar1 = strcmp(pcVar10,"splitting");
  if ((iVar1 != 0) && (iVar1 = strcmp(pcVar10,"forcing"), iVar1 != 0)) {
    fprintf(_stderr,"Invalid integrator: %s\nMust be \'splitting\' or \'forcing\'\n",pcVar10);
    return 1;
  }
  if (argc < 3) {
    pcVar11 = (char *)0x0;
  }
  else {
    pcVar11 = argv[2];
  }
  local_70 = 2.0;
  uVar2 = SUNContext_Create(0,&local_88);
  if ((int)uVar2 < 0) {
    pcVar10 = "SUNContext_Create";
  }
  else {
    lVar3 = N_VNew_Serial(1,local_88);
    if (lVar3 == 0) {
      main_cold_7();
      return 1;
    }
    N_VConst(0x3ff0000000000000,lVar3);
    uVar4 = N_VClone(lVar3);
    pdVar5 = (double *)N_VGetArrayPointer(lVar3);
    local_80 = *pdVar5;
    local_78 = local_80 * local_70;
    local_48 = local_80 - local_70;
    dVar12 = exp(local_70);
    local_78 = local_78 / (local_80 - dVar12 * local_48);
    local_80 = (double)uVar4;
    pdVar5 = (double *)N_VGetArrayPointer(uVar4);
    *pdVar5 = local_78;
    puts("\nAnalytical ODE test problem:");
    printf("   integrator = %s method\n",pcVar10);
    if (pcVar11 != (char *)0x0) {
      printf("   coefficients = %s\n",pcVar11);
    }
    printf("   lambda     = %g\n",local_70);
    lVar6 = ERKStepCreate(0,f_linear,lVar3,local_88);
    local_38 = lVar6;
    if (lVar6 == 0) {
      main_cold_6();
      return 1;
    }
    uVar2 = ARKodeSetUserData(lVar6,&local_70);
    if ((int)uVar2 < 0) {
      pcVar10 = "ARKodeSetUserData";
    }
    else {
      uVar2 = ARKodeSetFixedStep(0x3f60624dd2f1a9fc,lVar6);
      if (-1 < (int)uVar2) {
        lVar7 = ARKStepCreate(0,f_nonlinear,0,lVar3,local_88);
        local_40 = lVar7;
        if (lVar7 == 0) {
          main_cold_5();
          return 1;
        }
        uVar2 = ARKodeSetFixedStep(0x3f50624dd2f1a9fc,lVar7);
        if (-1 < (int)uVar2) {
          ARKodeCreateSUNStepper(lVar6,&local_68);
          ARKodeCreateSUNStepper(lVar7,&local_60);
          iVar1 = strcmp(pcVar10,"splitting");
          if (iVar1 == 0) {
            lVar8 = SplittingStepCreate(0,&local_68,2,lVar3,local_88);
            local_50 = lVar8;
            if (lVar8 == 0) {
              main_cold_4();
              return 1;
            }
            if (pcVar11 != (char *)0x0) {
              local_58 = SplittingStepCoefficients_LoadCoefficientsByName(pcVar11);
              if (local_58 == 0) {
                main_cold_2();
                return 1;
              }
              uVar2 = SplittingStepSetCoefficients(lVar8,local_58);
              if ((int)uVar2 < 0) {
                pcVar10 = "SplittingStepSetCoefficients";
                goto LAB_00101899;
              }
              SplittingStepCoefficients_Destroy(&local_58);
            }
          }
          else {
            lVar8 = ForcingStepCreate(0,local_68,local_60,lVar3,local_88);
            local_50 = lVar8;
            if (lVar8 == 0) {
              main_cold_1();
              return 1;
            }
          }
          uVar2 = ARKodeSetFixedStep(0x3f847ae147ae147b,lVar8);
          if (-1 < (int)uVar2) {
            uVar2 = ARKodeEvolve(0x3ff0000000000000,lVar8,lVar3,&local_58,1);
            if ((int)uVar2 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                      (ulong)uVar2);
              return 1;
            }
            lVar9 = N_VClone(lVar3);
            if (lVar9 == 0) {
              main_cold_3();
              return 1;
            }
            N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,lVar3,local_80,lVar9);
            N_VMaxNorm(lVar9);
            printf("\nError: %g\n");
            puts("\nSplitting Stepper Statistics:");
            uVar2 = ARKodePrintAllStats(lVar8,_stdout,0);
            if (-1 < (int)uVar2) {
              puts("\nLinear Stepper Statistics:");
              uVar2 = ARKodePrintAllStats(lVar6,_stdout,0);
              if (-1 < (int)uVar2) {
                puts("\nNonlinear Stepper Statistics:");
                uVar2 = ARKodePrintAllStats(lVar7,_stdout,0);
                if (-1 < (int)uVar2) {
                  N_VDestroy(lVar3);
                  N_VDestroy(local_80);
                  N_VDestroy(lVar9);
                  ARKodeFree(&local_38);
                  SUNStepper_Destroy(&local_68);
                  ARKodeFree(&local_40);
                  SUNStepper_Destroy(&local_60);
                  ARKodeFree(&local_50);
                  SUNContext_Free(&local_88);
                  return 0;
                }
              }
            }
            pcVar10 = "ARKodePrintAllStats";
            goto LAB_00101899;
          }
        }
      }
      pcVar10 = "ARKodeSetFixedStep";
    }
  }
LAB_00101899:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar10,(ulong)uVar2);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Parse arguments */
  const char* integrator_name = (argc > 1) ? argv[1] : "splitting";
  if (strcmp(integrator_name, "splitting") != 0 &&
      strcmp(integrator_name, "forcing") != 0)
  {
    fprintf(stderr, "Invalid integrator: %s\nMust be 'splitting' or 'forcing'\n",
            integrator_name);
    return 1;
  }
  char* coefficients_name = (argc > 2) ? argv[2] : NULL;

  /* Problem parameters */
  sunrealtype t0           = SUN_RCONST(0.0);  /* initial time */
  sunrealtype tf           = SUN_RCONST(1.0);  /* final time */
  sunrealtype dt           = SUN_RCONST(0.01); /* outer time step */
  sunrealtype dt_linear    = dt / 5;           /* linear integrator time step */
  sunrealtype dt_nonlinear = dt / 10; /* nonlinear integrator time step */

  UserData user_data = {.lambda = SUN_RCONST(2.0)};

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  int flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initialize vector with initial condition */
  N_Vector y = N_VNew_Serial(1, ctx);
  if (check_flag(y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(1.0), y);

  N_Vector y_exact = exact_sol(y, tf, &user_data);

  printf("\nAnalytical ODE test problem:\n");
  printf("   integrator = %s method\n", integrator_name);
  if (coefficients_name != NULL)
  {
    printf("   coefficients = %s\n", coefficients_name);
  }
  printf("   lambda     = %" GSYM "\n", user_data.lambda);

  /* Create the integrator for the linear partition */
  void* linear_mem = ERKStepCreate(f_linear, t0, y, ctx);
  if (check_flag(linear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetUserData(linear_mem, &user_data);
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSetFixedStep(linear_mem, dt_linear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create the integrator for the nonlinear partition */
  void* nonlinear_mem = ARKStepCreate(f_nonlinear, NULL, t0, y, ctx);
  if (check_flag(nonlinear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetFixedStep(nonlinear_mem, dt_nonlinear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create SUNSteppers out of the integrators */
  SUNStepper steppers[2];
  ARKodeCreateSUNStepper(linear_mem, &steppers[0]);
  ARKodeCreateSUNStepper(nonlinear_mem, &steppers[1]);

  /* Create the outer integrator */
  void* arkode_mem;
  if (strcmp(integrator_name, "splitting") == 0)
  {
    arkode_mem = SplittingStepCreate(steppers, 2, t0, y, ctx);
    if (check_flag(arkode_mem, "SplittingStepCreate", 0)) { return 1; }

    if (coefficients_name != NULL)
    {
      SplittingStepCoefficients coefficients =
        SplittingStepCoefficients_LoadCoefficientsByName(coefficients_name);
      if (check_flag(coefficients,
                     "SplittingStepCoefficients_LoadCoefficientsByName", 0))
      {
        return 1;
      }

      flag = SplittingStepSetCoefficients(arkode_mem, coefficients);
      if (check_flag(&flag, "SplittingStepSetCoefficients", 1)) { return 1; }

      SplittingStepCoefficients_Destroy(&coefficients);
    }
  }
  else
  {
    arkode_mem = ForcingStepCreate(steppers[0], steppers[1], t0, y, ctx);
    if (check_flag(arkode_mem, "ForcingStepCreate", 0)) { return 1; }
  }

  flag = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Compute the numerical solution */
  sunrealtype tret;
  flag = ARKodeEvolve(arkode_mem, tf, y, &tret, ARK_NORMAL);
  if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

  /* Print the numerical error and statistics */
  N_Vector y_err = N_VClone(y);
  if (check_flag(y_err, "N_VClone", 0)) { return 1; }
  N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), y_exact, y_err);
  printf("\nError: %" GSYM "\n", N_VMaxNorm(y_err));

  printf("\nSplitting Stepper Statistics:\n");
  flag = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nLinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(linear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nNonlinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(nonlinear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(y_exact);
  N_VDestroy(y_err);
  ARKodeFree(&linear_mem);
  SUNStepper_Destroy(&steppers[0]);
  ARKodeFree(&nonlinear_mem);
  SUNStepper_Destroy(&steppers[1]);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&ctx);

  return 0;
}